

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::RenameColumnInfo::RenameColumnInfo
          (RenameColumnInfo *this,AlterEntryData *data,string *old_name_p,string *new_name_p)

{
  AlterEntryData AStack_88;
  
  AlterEntryData::AlterEntryData(&AStack_88,data);
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,RENAME_COLUMN,&AStack_88);
  AlterEntryData::~AlterEntryData(&AStack_88);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameColumnInfo_027923b0;
  ::std::__cxx11::string::string((string *)&this->old_name,(string *)old_name_p);
  ::std::__cxx11::string::string((string *)&this->new_name,(string *)new_name_p);
  return;
}

Assistant:

RenameColumnInfo::RenameColumnInfo(AlterEntryData data, string old_name_p, string new_name_p)
    : AlterTableInfo(AlterTableType::RENAME_COLUMN, std::move(data)), old_name(std::move(old_name_p)),
      new_name(std::move(new_name_p)) {
}